

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_passthrough_dotdot.c
# Opt level: O3

void test_passthrough_dotdot(void)

{
  wchar_t wVar1;
  FILE *__s;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                  ,L'\x12',L'\0');
  __s = fopen("filelist","w");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                     ,L'\x1a',"dir",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                  ,L'\x1b',"dir");
  fwrite(".\n",2,1,__s);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                      ,L' ',"file",L'Ƣ',L'\xffffffff',"1234567890");
  fwrite("file\n",5,1,__s);
  fclose(__s);
  wVar1 = systemf("%s -pdvm .. <../filelist >../stdout 2>../stderr",testprog);
  failure("Error invoking %s -pd ..",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                      ,L'-',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                  ,L'/',"..");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
             ,L'2',"../.\n../file\n1 block\n","stderr");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
             ,L'3',"stdout");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                   ,L'6',"file",L'Ƣ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
                      ,L'7',"file",10);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_passthrough_dotdot.c"
             ,L'8',"file",L'\x01');
  return;
}

Assistant:

DEFINE_TEST(test_passthrough_dotdot)
{
	int r;
	FILE *filelist;

	assertUmask(0);

	/*
	 * Create an assortment of files on disk.
	 */
	filelist = fopen("filelist", "w");

	/* Directory. */
	assertMakeDir("dir", 0755);
	assertChdir("dir");

	fprintf(filelist, ".\n");

	/* File with 10 bytes content. */
	assertMakeFile("file", 0642, "1234567890");
	fprintf(filelist, "file\n");

	/* All done. */
	fclose(filelist);


	/*
	 * Use cpio passthrough mode to copy files to another directory.
	 */
	r = systemf("%s -pdvm .. <../filelist >../stdout 2>../stderr",
	    testprog);
	failure("Error invoking %s -pd ..", testprog);
	assertEqualInt(r, 0);

	assertChdir("..");

	/* Verify stderr and stdout. */
	assertTextFileContents("../.\n../file\n1 block\n", "stderr");
	assertEmptyFile("stdout");

	/* Regular file. */
	assertIsReg("file", 0642);
	assertFileSize("file", 10);
	assertFileNLinks("file", 1);
}